

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus checkOption(HighsLogOptions *report_log_options,OptionRecordInt *option)

{
  uint uVar1;
  undefined8 uVar2;
  long in_RSI;
  HighsLogOptions *in_RDI;
  HighsInt value;
  OptionStatus local_4;
  
  if (*(int *)(in_RSI + 0x68) < *(int *)(in_RSI + 0x60)) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser(in_RDI,kError,"checkOption: Option \"%s\" has inconsistent bounds [%d, %d]\n",uVar2
                 ,(ulong)*(uint *)(in_RSI + 0x60),(ulong)*(uint *)(in_RSI + 0x68));
    local_4 = kIllegalValue;
  }
  else if ((*(int *)(in_RSI + 100) < *(int *)(in_RSI + 0x60)) ||
          (*(int *)(in_RSI + 0x68) < *(int *)(in_RSI + 100))) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser(in_RDI,kError,
                 "checkOption: Option \"%s\" has default value %d inconsistent with bounds [%d, %d]\n"
                 ,uVar2,(ulong)*(uint *)(in_RSI + 100),(ulong)*(uint *)(in_RSI + 0x60),
                 *(undefined4 *)(in_RSI + 0x68));
    local_4 = kIllegalValue;
  }
  else {
    uVar1 = **(uint **)(in_RSI + 0x58);
    if (((int)uVar1 < *(int *)(in_RSI + 0x60)) || (*(int *)(in_RSI + 0x68) < (int)uVar1)) {
      uVar2 = std::__cxx11::string::c_str();
      highsLogUser(in_RDI,kError,
                   "checkOption: Option \"%s\" has value %d inconsistent with bounds [%d, %d]\n",
                   uVar2,(ulong)uVar1,(ulong)*(uint *)(in_RSI + 0x60),*(undefined4 *)(in_RSI + 0x68)
                  );
      local_4 = kIllegalValue;
    }
    else {
      local_4 = kOk;
    }
  }
  return local_4;
}

Assistant:

OptionStatus checkOption(const HighsLogOptions& report_log_options,
                         const OptionRecordInt& option) {
  if (option.lower_bound > option.upper_bound) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "checkOption: Option \"%s\" has inconsistent bounds [%" HIGHSINT_FORMAT
        ", %" HIGHSINT_FORMAT "]\n",
        option.name.c_str(), option.lower_bound, option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  if (option.default_value < option.lower_bound ||
      option.default_value > option.upper_bound) {
    highsLogUser(
        report_log_options, HighsLogType::kError,
        "checkOption: Option \"%s\" has default value %" HIGHSINT_FORMAT
        " "
        "inconsistent with bounds [%" HIGHSINT_FORMAT ", %" HIGHSINT_FORMAT
        "]\n",
        option.name.c_str(), option.default_value, option.lower_bound,
        option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  HighsInt value = *option.value;
  if (value < option.lower_bound || value > option.upper_bound) {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "checkOption: Option \"%s\" has value %" HIGHSINT_FORMAT
                 " inconsistent with "
                 "bounds [%" HIGHSINT_FORMAT ", %" HIGHSINT_FORMAT "]\n",
                 option.name.c_str(), value, option.lower_bound,
                 option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  return OptionStatus::kOk;
}